

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void rw::Engine::stop(void)

{
  FILE *__stream;
  char *pcVar1;
  uint local_14;
  uint32 local_10;
  uint i;
  Error _e;
  
  if ((engine == (void *)0x0) || (state != 3)) {
    local_10 = 0;
    i = 0x80000001;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/engine.cpp"
            ,0x167);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000001);
    fprintf(__stream,"%s\n",pcVar1);
    setError((Error *)&stack0xfffffffffffffff0);
  }
  else {
    for (local_14 = 0; local_14 < 0xd; local_14 = local_14 + 1) {
      PluginList::destruct
                ((PluginList *)(Driver::s_plglist + (ulong)local_14 * 0x18),
                 *(void **)((long)engine + (ulong)local_14 * 8 + 0x20));
    }
    PluginList::destruct((PluginList *)&s_plglist,engine);
    (**(code **)((long)engine + 0x108))(1,0,0);
    state = 2;
  }
  return;
}

Assistant:

void
Engine::stop(void)
{
	if(engine == nil || Engine::state != Started){
		RWERROR((ERR_GENERAL));
		return;
	}

	for(uint i = 0; i < NUM_PLATFORMS; i++)
		Driver::s_plglist[i].destruct(rw::engine->driver[i]);
	Engine::s_plglist.destruct(engine);

	engine->device.system(DEVICETERM, nil, 0);

	Engine::state = Opened;
}